

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O3

void __thiscall jaegertracing::Span::Span(Span *this,Span *span)

{
  SpanContext local_e0;
  
  *(undefined **)this = &std::bad_alloc::vtable;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined ***)(this + 0x18) = &PTR__SpanContext_0020a2e8;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  this[0x40] = (Span)0x0;
  *(Span **)(this + 0x48) = this + 0x78;
  *(undefined8 *)(this + 0x50) = 1;
  *(undefined8 *)(this + 0x58) = 0;
  *(undefined8 *)(this + 0x60) = 0;
  *(undefined4 *)(this + 0x68) = 0x3f800000;
  *(undefined8 *)(this + 0x70) = 0;
  *(undefined8 *)(this + 0x78) = 0;
  *(Span **)(this + 0x80) = this + 0x90;
  *(undefined8 *)(this + 0x88) = 0;
  this[0x90] = (Span)0x0;
  *(undefined8 *)(this + 0xa0) = 0;
  *(undefined8 *)(this + 0xa8) = 0;
  *(undefined8 *)(this + 0xb0) = 0;
  *(undefined8 *)(this + 0xb8) = 0;
  *(undefined8 *)(this + 0xc0) = 0;
  *(Span **)(this + 200) = this + 0xd8;
  *(undefined8 *)(this + 0xd0) = 0;
  this[0xd8] = (Span)0x0;
  *(undefined8 *)(this + 0xe8) = 0;
  *(undefined8 *)(this + 0xf0) = 0;
  *(undefined8 *)(this + 0x160) = 0;
  *(undefined8 *)(this + 0x168) = 0;
  *(undefined8 *)(this + 0x150) = 0;
  *(undefined8 *)(this + 0x158) = 0;
  *(undefined8 *)(this + 0x140) = 0;
  *(undefined8 *)(this + 0x148) = 0;
  *(undefined8 *)(this + 0x130) = 0;
  *(undefined8 *)(this + 0x138) = 0;
  *(undefined8 *)(this + 0x120) = 0;
  *(undefined8 *)(this + 0x128) = 0;
  *(undefined8 *)(this + 0x110) = 0;
  *(undefined8 *)(this + 0x118) = 0;
  *(undefined8 *)(this + 0x100) = 0;
  *(undefined8 *)(this + 0x108) = 0;
  std::lock<std::mutex,std::mutex>
            ((mutex *)&((pthread_mutex_t *)(this + 0x148))->__data,
             (mutex *)&((pthread_mutex_t *)(span + 0x148))->__data);
  *(undefined8 *)(this + 8) = *(undefined8 *)(span + 8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 0x10),
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(span + 0x10));
  SpanContext::SpanContext(&local_e0,(SpanContext *)(span + 0x18));
  SpanContext::swap((SpanContext *)(this + 0x18),&local_e0);
  local_e0.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_0020a2e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._debugID._M_dataplus._M_p != &local_e0._debugID.field_2) {
    operator_delete(local_e0._debugID._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_e0._baggage._M_h);
  std::__cxx11::string::_M_assign((string *)(this + 200));
  *(undefined8 *)(this + 0xe8) = *(undefined8 *)(span + 0xe8);
  *(undefined8 *)(this + 0xf0) = *(undefined8 *)(span + 0xf0);
  *(undefined8 *)(this + 0xf8) = *(undefined8 *)(span + 0xf8);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::operator=
            ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(this + 0x100),
             (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(span + 0x100));
  std::vector<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_>::operator=
            ((vector<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_> *)
             (this + 0x118),
             (vector<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_> *)
             (span + 0x118));
  std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::operator=
            ((vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *)
             (this + 0x130),
             (vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *)
             (span + 0x130));
  pthread_mutex_unlock((pthread_mutex_t *)(span + 0x148));
  pthread_mutex_unlock((pthread_mutex_t *)(this + 0x148));
  return;
}

Assistant:

Span(const Span& span)
    {
        std::lock(_mutex, span._mutex);
        std::lock_guard<std::mutex> lock(_mutex, std::adopt_lock);
        std::lock_guard<std::mutex> spanLock(span._mutex, std::adopt_lock);

        _tracer = span._tracer;
        _context = span._context;
        _operationName = span._operationName;
        _startTimeSystem = span._startTimeSystem;
        _startTimeSteady = span._startTimeSteady;
        _duration = span._duration;
        _tags = span._tags;
        _logs = span._logs;
        _references = span._references;
    }